

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_NtkFindNodes2_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar3 = (p->vObjTrav).pArray;
    iVar1 = p->nObjTravs;
    iVar2 = piVar3[(uint)iObj];
    piVar3[(uint)iObj] = iVar1;
    if (iVar2 == iVar1) {
      return;
    }
    if (iObj == 0) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                    ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
    }
    if (iObj < (p->vObjType).nSize) {
      if ((p->vObjType).pArray[(uint)iObj] == '\x03') {
        return;
      }
      if ((p->vObjFans).nSize <= iObj) goto LAB_003b3376;
      iVar1 = (p->vObjFans).pArray[(uint)iObj];
      lVar6 = (long)iVar1;
      if ((lVar6 < 0) || ((p->vFanSto).nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar3 = (p->vFanSto).pArray;
      if (0 < piVar3[lVar6]) {
        lVar5 = 0;
        do {
          lVar4 = lVar5 + 1;
          lVar5 = lVar5 + 1;
          Acb_NtkFindNodes2_rec(p,piVar3[lVar6 + lVar4],vNodes);
        } while (lVar5 < piVar3[lVar6]);
      }
      if (iObj < (p->vObjType).nSize) {
        if ((p->vObjType).pArray[(uint)iObj] == '\x04') {
          __assert_fail("!Acb_ObjIsCo(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbUtil.c"
                        ,0x2ce,"void Acb_NtkFindNodes2_rec(Acb_Ntk_t *, int, Vec_Int_t *)");
        }
        Vec_IntPush(vNodes,iObj);
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
LAB_003b3376:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkFindNodes2_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vNodes )
{
    int * pFanin, iFanin, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Acb_ObjIsCi(p, iObj) )
        return;
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
        Acb_NtkFindNodes2_rec( p, iFanin, vNodes );
    assert( !Acb_ObjIsCo(p, iObj) );
    Vec_IntPush( vNodes, iObj );
}